

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *descriptor,
          bool immutable)

{
  ulong uVar1;
  string local_58;
  undefined1 local_22;
  byte local_21;
  FileDescriptor *pFStack_20;
  bool immutable_local;
  FileDescriptor *descriptor_local;
  ClassNameResolver *this_local;
  string *result;
  
  local_22 = 0;
  local_21 = immutable;
  pFStack_20 = descriptor;
  descriptor_local = (FileDescriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  FileJavaPackage_abi_cxx11_
            (__return_storage_ptr__,(java *)descriptor,(FileDescriptor *)(ulong)immutable,
             SUB81(__return_storage_ptr__,0));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
  }
  GetFileClassName_abi_cxx11_(&local_58,this,pFStack_20,(bool)(local_21 & 1));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetClassName(const FileDescriptor* descriptor,
                                       bool immutable) {
  string result = FileJavaPackage(descriptor, immutable);
  if (!result.empty()) result += '.';
  result += GetFileClassName(descriptor, immutable);
  return result;
}